

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_backend_nodes_list.cpp
# Opt level: O2

PGList * duckdb_libpgquery::list_copy(PGList *oldlist)

{
  PGList *pPVar1;
  PGListCell *pPVar2;
  PGListCell *pPVar3;
  PGListCell *pPVar4;
  
  if (oldlist == (PGList *)0x0) {
    pPVar1 = (PGList *)0x0;
  }
  else {
    pPVar1 = new_list(oldlist->type);
    pPVar1->length = oldlist->length;
    pPVar1->head->data = oldlist->head->data;
    pPVar3 = oldlist->head;
    pPVar4 = pPVar1->head;
    while (pPVar3 = pPVar3->next, pPVar3 != (PGListCell *)0x0) {
      pPVar2 = (PGListCell *)palloc(0x10);
      pPVar2->data = pPVar3->data;
      pPVar4->next = pPVar2;
      pPVar4 = pPVar2;
    }
    pPVar4->next = (PGListCell *)0x0;
    pPVar1->tail = pPVar4;
  }
  return pPVar1;
}

Assistant:

PGList *
list_copy(const PGList *oldlist)
{
	PGList	   *newlist;
	PGListCell   *newlist_prev;
	PGListCell   *oldlist_cur;

	if (oldlist == NIL)
		return NIL;

	newlist = new_list(oldlist->type);
	newlist->length = oldlist->length;

	/*
	 * Copy over the data in the first cell; new_list() has already allocated
	 * the head cell itself
	 */
	newlist->head->data = oldlist->head->data;

	newlist_prev = newlist->head;
	oldlist_cur = oldlist->head->next;
	while (oldlist_cur)
	{
		PGListCell   *newlist_cur;

		newlist_cur = (PGListCell *) palloc(sizeof(*newlist_cur));
		newlist_cur->data = oldlist_cur->data;
		newlist_prev->next = newlist_cur;

		newlist_prev = newlist_cur;
		oldlist_cur = oldlist_cur->next;
	}

	newlist_prev->next = NULL;
	newlist->tail = newlist_prev;

	check_list_invariants(newlist);
	return newlist;
}